

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O1

btScalar __thiscall
btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup
          (btSequentialImpulseConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifoldPtr,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btContactSolverInfo *infoGlobal,btIDebugDraw *debugDrawer)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  btSolverBody *pbVar17;
  btRigidBody *pbVar18;
  btTypedConstraint *pbVar19;
  btConstraintInfo1 *ptr;
  undefined4 *puVar20;
  long *plVar21;
  btSolverConstraint *ptr_00;
  btRigidBody *body;
  btRigidBody *pbVar22;
  int *piVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  btConstraintInfo1 *pbVar28;
  btSolverConstraint *pbVar29;
  anon_union_8_3_f9adb342_for_btSolverConstraint_15 *paVar30;
  int *piVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  float fVar36;
  btScalar bVar37;
  float fVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  btScalar bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  btScalar bVar50;
  undefined1 auVar51 [16];
  btScalar bVar52;
  float fVar53;
  btScalar bVar54;
  float fVar55;
  btScalar bVar56;
  btScalar bVar57;
  btScalar bVar58;
  btVector3 bVar59;
  btConstraintInfo2 info2;
  btSolverBody *local_1f8;
  float local_128;
  btScalar local_124;
  btVector3 *local_120;
  btSolverConstraint *local_118;
  btVector3 *pbStack_110;
  btVector3 *local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  btScalar *local_f8;
  btScalar *pbStack_f0;
  btScalar *local_e8;
  btScalar *local_e0;
  int local_d0;
  float local_cc;
  
  this->m_fixedBodyId = -1;
  CProfileManager::Start_Profile("solveGroupCacheFriendlySetup");
  this->m_maxOverrideNumSolverIterations = 0;
  if (0 < numBodies) {
    uVar26 = 0;
    do {
      bodies[uVar26]->m_companionId = -1;
      uVar26 = uVar26 + 1;
    } while ((uint)numBodies != uVar26);
  }
  if ((this->m_tmpSolverBodyPool).m_capacity <= numBodies) {
    iVar33 = numBodies + 1;
    if (iVar33 == 0) {
      local_1f8 = (btSolverBody *)0x0;
    }
    else {
      local_1f8 = (btSolverBody *)btAlignedAllocInternal((long)iVar33 * 0xf8,0x10);
    }
    lVar27 = (long)(this->m_tmpSolverBodyPool).m_size;
    if (0 < lVar27) {
      lVar32 = 0;
      do {
        puVar2 = (undefined8 *)
                 ((long)(((this->m_tmpSolverBodyPool).m_data)->m_worldTransform).m_basis.m_el[0].
                        m_floats + lVar32);
        uVar13 = puVar2[1];
        puVar1 = (undefined8 *)
                 ((long)(local_1f8->m_worldTransform).m_basis.m_el[0].m_floats + lVar32);
        *puVar1 = *puVar2;
        puVar1[1] = uVar13;
        uVar13 = puVar2[3];
        puVar1 = (undefined8 *)
                 ((long)(local_1f8->m_worldTransform).m_basis.m_el[1].m_floats + lVar32);
        *puVar1 = puVar2[2];
        puVar1[1] = uVar13;
        uVar13 = puVar2[5];
        puVar1 = (undefined8 *)
                 ((long)(local_1f8->m_worldTransform).m_basis.m_el[2].m_floats + lVar32);
        *puVar1 = puVar2[4];
        puVar1[1] = uVar13;
        uVar13 = puVar2[7];
        puVar1 = (undefined8 *)((long)(local_1f8->m_worldTransform).m_origin.m_floats + lVar32);
        *puVar1 = puVar2[6];
        puVar1[1] = uVar13;
        memcpy((void *)((long)(local_1f8->m_deltaLinearVelocity).m_floats + lVar32),puVar2 + 8,0xb8)
        ;
        lVar32 = lVar32 + 0xf8;
      } while (lVar27 * 0xf8 - lVar32 != 0);
    }
    pbVar17 = (this->m_tmpSolverBodyPool).m_data;
    if (pbVar17 != (btSolverBody *)0x0) {
      if ((this->m_tmpSolverBodyPool).m_ownsMemory == true) {
        btAlignedFreeInternal(pbVar17);
      }
      (this->m_tmpSolverBodyPool).m_data = (btSolverBody *)0x0;
    }
    (this->m_tmpSolverBodyPool).m_ownsMemory = true;
    (this->m_tmpSolverBodyPool).m_data = local_1f8;
    (this->m_tmpSolverBodyPool).m_capacity = iVar33;
  }
  memset(&local_128,0,0xf8);
  iVar33 = (this->m_tmpSolverBodyPool).m_size;
  lVar27 = (long)iVar33;
  if (lVar27 < 1) {
    if ((iVar33 < 0) && ((this->m_tmpSolverBodyPool).m_capacity < 0)) {
      pbVar17 = (this->m_tmpSolverBodyPool).m_data;
      if (pbVar17 != (btSolverBody *)0x0) {
        if ((this->m_tmpSolverBodyPool).m_ownsMemory == true) {
          btAlignedFreeInternal(pbVar17);
        }
        (this->m_tmpSolverBodyPool).m_data = (btSolverBody *)0x0;
      }
      (this->m_tmpSolverBodyPool).m_ownsMemory = true;
      (this->m_tmpSolverBodyPool).m_data = (btSolverBody *)0x0;
      (this->m_tmpSolverBodyPool).m_capacity = 0;
    }
    if (iVar33 < 0) {
      lVar32 = lVar27 * 0xf8 + 0x40;
      do {
        pbVar17 = (this->m_tmpSolverBodyPool).m_data;
        puVar2 = (undefined8 *)((long)(&pbVar17->m_worldTransform + -1) + lVar32);
        *puVar2 = 0;
        puVar2[1] = 0;
        plVar21 = (long *)((long)(&(pbVar17->m_worldTransform).m_basis + -1) + lVar32);
        *plVar21 = (long)local_118;
        plVar21[1] = (long)pbStack_110;
        plVar21 = (long *)((long)((pbVar17->m_worldTransform).m_basis.m_el + -2) + lVar32);
        *plVar21 = (long)local_108;
        plVar21[1] = CONCAT44(uStack_fc,uStack_100);
        plVar21 = (long *)((long)((pbVar17->m_worldTransform).m_basis.m_el + -1) + lVar32);
        *plVar21 = (long)local_f8;
        plVar21[1] = (long)pbStack_f0;
        memcpy((void *)((long)(pbVar17->m_worldTransform).m_basis.m_el[0].m_floats + lVar32),
               &local_e8,0xb8);
        lVar32 = lVar32 + 0xf8;
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0);
    }
  }
  (this->m_tmpSolverBodyPool).m_size = 0;
  if (0 < numBodies) {
    uVar26 = 0;
    do {
      iVar33 = getOrInitSolverBody(this,bodies[uVar26],
                                   (infoGlobal->super_btContactSolverInfoData).m_timeStep);
      pbVar18 = (btRigidBody *)bodies[uVar26];
      if (((pbVar18 != (btRigidBody *)0x0) &&
          (((pbVar18->super_btCollisionObject).m_internalType & 2U) != 0)) &&
         ((pbVar18->m_inverseMass != 0.0 || (NAN(pbVar18->m_inverseMass))))) {
        pbVar17 = (this->m_tmpSolverBodyPool).m_data;
        if ((pbVar18->m_rigidbodyFlags & 2) != 0) {
          bVar59 = btRigidBody::computeGyroscopicForceExplicit
                             (pbVar18,(infoGlobal->super_btContactSolverInfoData).
                                      m_maxGyroscopicForce);
          fVar36 = bVar59.m_floats[0];
          fVar41 = bVar59.m_floats[1];
          fVar3 = *(float *)&pbVar18->field_0x164;
          fVar4 = *(float *)&pbVar18->field_0x154;
          fVar5 = *(float *)&pbVar18->field_0x174;
          fVar42 = bVar59.m_floats[2];
          fVar6 = (infoGlobal->super_btContactSolverInfoData).m_timeStep;
          uVar13 = *(undefined8 *)pbVar17[iVar33].m_externalTorqueImpulse.m_floats;
          *(ulong *)pbVar17[iVar33].m_externalTorqueImpulse.m_floats =
               CONCAT44((float)((ulong)uVar13 >> 0x20) -
                        fVar6 * (fVar42 * (float)((ulong)*(undefined8 *)&pbVar18->field_0x16c >>
                                                 0x20) +
                                fVar36 * *(float *)&pbVar18->field_0x150 +
                                (float)((ulong)*(undefined8 *)&pbVar18->field_0x15c >> 0x20) *
                                fVar41),
                        (float)uVar13 -
                        fVar6 * (fVar42 * (float)*(undefined8 *)&pbVar18->field_0x16c +
                                fVar36 * *(float *)&(pbVar18->super_btCollisionObject).field_0x14c +
                                (float)*(undefined8 *)&pbVar18->field_0x15c * fVar41));
          pbVar17[iVar33].m_externalTorqueImpulse.m_floats[2] =
               pbVar17[iVar33].m_externalTorqueImpulse.m_floats[2] -
               (fVar5 * fVar42 + fVar4 * fVar36 + fVar3 * fVar41) * fVar6;
        }
        if ((pbVar18->m_rigidbodyFlags & 4) != 0) {
          bVar59 = btRigidBody::computeGyroscopicImpulseImplicit_World
                             (pbVar18,(infoGlobal->super_btContactSolverInfoData).m_timeStep);
          fVar3 = pbVar17[iVar33].m_externalTorqueImpulse.m_floats[1];
          pbVar17[iVar33].m_externalTorqueImpulse.m_floats[0] =
               bVar59.m_floats[0] + pbVar17[iVar33].m_externalTorqueImpulse.m_floats[0];
          pbVar17[iVar33].m_externalTorqueImpulse.m_floats[1] = bVar59.m_floats[1] + fVar3;
          pbVar17[iVar33].m_externalTorqueImpulse.m_floats[2] =
               bVar59.m_floats[2] + pbVar17[iVar33].m_externalTorqueImpulse.m_floats[2];
        }
        if ((pbVar18->m_rigidbodyFlags & 8) != 0) {
          bVar59 = btRigidBody::computeGyroscopicImpulseImplicit_Body
                             (pbVar18,(infoGlobal->super_btContactSolverInfoData).m_timeStep);
          fVar3 = pbVar17[iVar33].m_externalTorqueImpulse.m_floats[1];
          pbVar17[iVar33].m_externalTorqueImpulse.m_floats[0] =
               bVar59.m_floats[0] + pbVar17[iVar33].m_externalTorqueImpulse.m_floats[0];
          pbVar17[iVar33].m_externalTorqueImpulse.m_floats[1] = bVar59.m_floats[1] + fVar3;
          pbVar17[iVar33].m_externalTorqueImpulse.m_floats[2] =
               bVar59.m_floats[2] + pbVar17[iVar33].m_externalTorqueImpulse.m_floats[2];
        }
      }
      uVar26 = uVar26 + 1;
    } while ((uint)numBodies != uVar26);
  }
  uVar26 = (ulong)(uint)numConstraints;
  if (0 < numConstraints) {
    uVar35 = 0;
    do {
      pbVar19 = constraints[uVar35];
      (*pbVar19->_vptr_btTypedConstraint[2])();
      pbVar19->m_appliedImpulse = 0.0;
      uVar35 = uVar35 + 1;
    } while (uVar26 != uVar35);
  }
  if (((this->m_tmpConstraintSizesPool).m_size < numConstraints) &&
     ((this->m_tmpConstraintSizesPool).m_capacity < numConstraints)) {
    if (numConstraints == 0) {
      pbVar28 = (btConstraintInfo1 *)0x0;
    }
    else {
      pbVar28 = (btConstraintInfo1 *)btAlignedAllocInternal((long)numConstraints << 3,0x10);
    }
    lVar27 = (long)(this->m_tmpConstraintSizesPool).m_size;
    if (0 < lVar27) {
      lVar32 = 0;
      do {
        pbVar28[lVar32] = (this->m_tmpConstraintSizesPool).m_data[lVar32];
        lVar32 = lVar32 + 1;
      } while (lVar27 != lVar32);
    }
    ptr = (this->m_tmpConstraintSizesPool).m_data;
    if (ptr != (btConstraintInfo1 *)0x0) {
      if ((this->m_tmpConstraintSizesPool).m_ownsMemory == true) {
        btAlignedFreeInternal(ptr);
      }
      (this->m_tmpConstraintSizesPool).m_data = (btConstraintInfo1 *)0x0;
    }
    (this->m_tmpConstraintSizesPool).m_ownsMemory = true;
    (this->m_tmpConstraintSizesPool).m_data = pbVar28;
    (this->m_tmpConstraintSizesPool).m_capacity = numConstraints;
  }
  (this->m_tmpConstraintSizesPool).m_size = numConstraints;
  if (numConstraints < 1) {
    iVar33 = 0;
  }
  else {
    lVar27 = 0;
    iVar33 = 0;
    do {
      pbVar28 = (this->m_tmpConstraintSizesPool).m_data;
      puVar20 = *(undefined4 **)(*(long *)((long)constraints + lVar27) + 0x40);
      if (puVar20 != (undefined4 *)0x0) {
        puVar20[0xc] = 0;
        puVar20[0xd] = 0;
        puVar20[0xe] = 0;
        puVar20[0xf] = 0;
        puVar20[8] = 0;
        puVar20[9] = 0;
        puVar20[10] = 0;
        puVar20[0xb] = 0;
        puVar20[4] = 0;
        puVar20[5] = 0;
        puVar20[6] = 0;
        puVar20[7] = 0;
        *puVar20 = 0;
        puVar20[1] = 0;
        puVar20[2] = 0;
        puVar20[3] = 0;
      }
      piVar31 = (int *)((long)&pbVar28->m_numConstraintRows + lVar27);
      plVar21 = *(long **)((long)constraints + lVar27);
      if (*(char *)((long)plVar21 + 0x1c) == '\x01') {
        (**(code **)(*plVar21 + 0x20))(plVar21,piVar31);
      }
      else {
        *(undefined8 *)((long)&pbVar28->m_numConstraintRows + lVar27) = 0;
      }
      iVar33 = iVar33 + *piVar31;
      lVar27 = lVar27 + 8;
    } while (uVar26 * 8 - lVar27 != 0);
  }
  if (((this->m_tmpSolverNonContactConstraintPool).m_size < iVar33) &&
     ((this->m_tmpSolverNonContactConstraintPool).m_capacity < iVar33)) {
    if (iVar33 == 0) {
      pbVar29 = (btSolverConstraint *)0x0;
    }
    else {
      pbVar29 = (btSolverConstraint *)btAlignedAllocInternal((long)iVar33 * 0xa0,0x10);
    }
    lVar27 = (long)(this->m_tmpSolverNonContactConstraintPool).m_size;
    if (0 < lVar27) {
      lVar32 = 0;
      do {
        memcpy((void *)((long)(pbVar29->m_relpos1CrossNormal).m_floats + lVar32),
               (void *)((long)(((this->m_tmpSolverNonContactConstraintPool).m_data)->
                              m_relpos1CrossNormal).m_floats + lVar32),0xa0);
        lVar32 = lVar32 + 0xa0;
      } while (lVar27 * 0xa0 != lVar32);
    }
    ptr_00 = (this->m_tmpSolverNonContactConstraintPool).m_data;
    if (ptr_00 != (btSolverConstraint *)0x0) {
      if ((this->m_tmpSolverNonContactConstraintPool).m_ownsMemory == true) {
        btAlignedFreeInternal(ptr_00);
      }
      (this->m_tmpSolverNonContactConstraintPool).m_data = (btSolverConstraint *)0x0;
    }
    (this->m_tmpSolverNonContactConstraintPool).m_ownsMemory = true;
    (this->m_tmpSolverNonContactConstraintPool).m_data = pbVar29;
    (this->m_tmpSolverNonContactConstraintPool).m_capacity = iVar33;
  }
  (this->m_tmpSolverNonContactConstraintPool).m_size = iVar33;
  if (0 < numConstraints) {
    uVar35 = 0;
    iVar33 = 0;
    do {
      pbVar28 = (this->m_tmpConstraintSizesPool).m_data;
      if (pbVar28[uVar35].m_numConstraintRows != 0) {
        pbVar29 = (this->m_tmpSolverNonContactConstraintPool).m_data;
        pbVar19 = constraints[uVar35];
        pbVar18 = pbVar19->m_rbA;
        body = pbVar19->m_rbB;
        iVar24 = getOrInitSolverBody(this,&pbVar18->super_btCollisionObject,
                                     (infoGlobal->super_btContactSolverInfoData).m_timeStep);
        iVar25 = getOrInitSolverBody(this,&body->super_btCollisionObject,
                                     (infoGlobal->super_btContactSolverInfoData).m_timeStep);
        iVar34 = pbVar19->m_overrideNumSolverIterations;
        if (iVar34 < 1) {
          iVar34 = (infoGlobal->super_btContactSolverInfoData).m_numIterations;
        }
        if (this->m_maxOverrideNumSolverIterations < iVar34) {
          this->m_maxOverrideNumSolverIterations = iVar34;
        }
        pbVar17 = (this->m_tmpSolverBodyPool).m_data;
        if (0 < pbVar28[uVar35].m_numConstraintRows) {
          piVar31 = &pbVar29[iVar33].m_solverBodyIdB;
          lVar27 = 0;
          do {
            memset((btSolverConstraint *)(piVar31 + -0x27),0,0xa0);
            *(undefined8 *)(piVar31 + -9) = 0x7f7fffffff7fffff;
            *(undefined8 *)(piVar31 + -0xf) = 0;
            piVar31[-1] = iVar24;
            *piVar31 = iVar25;
            piVar31[-3] = iVar34;
            lVar27 = lVar27 + 1;
            piVar31 = piVar31 + 0x28;
          } while (lVar27 < pbVar28[uVar35].m_numConstraintRows);
        }
        pbVar17[iVar24].m_deltaAngularVelocity.m_floats[0] = 0.0;
        pbVar17[iVar24].m_deltaAngularVelocity.m_floats[1] = 0.0;
        pbVar17[iVar24].m_deltaAngularVelocity.m_floats[2] = 0.0;
        pbVar17[iVar24].m_deltaAngularVelocity.m_floats[3] = 0.0;
        pbVar17[iVar24].m_deltaLinearVelocity.m_floats[0] = 0.0;
        pbVar17[iVar24].m_deltaLinearVelocity.m_floats[1] = 0.0;
        pbVar17[iVar24].m_deltaLinearVelocity.m_floats[2] = 0.0;
        pbVar17[iVar24].m_deltaLinearVelocity.m_floats[3] = 0.0;
        pbVar17[iVar24].m_pushVelocity.m_floats[0] = 0.0;
        pbVar17[iVar24].m_pushVelocity.m_floats[1] = 0.0;
        pbVar17[iVar24].m_pushVelocity.m_floats[2] = 0.0;
        pbVar17[iVar24].m_pushVelocity.m_floats[3] = 0.0;
        pbVar17[iVar24].m_turnVelocity.m_floats[0] = 0.0;
        pbVar17[iVar24].m_turnVelocity.m_floats[1] = 0.0;
        pbVar17[iVar24].m_turnVelocity.m_floats[2] = 0.0;
        pbVar17[iVar24].m_turnVelocity.m_floats[3] = 0.0;
        pbVar17[iVar25].m_deltaAngularVelocity.m_floats[0] = 0.0;
        pbVar17[iVar25].m_deltaAngularVelocity.m_floats[1] = 0.0;
        pbVar17[iVar25].m_deltaAngularVelocity.m_floats[2] = 0.0;
        pbVar17[iVar25].m_deltaAngularVelocity.m_floats[3] = 0.0;
        pbVar17[iVar25].m_deltaLinearVelocity.m_floats[0] = 0.0;
        pbVar17[iVar25].m_deltaLinearVelocity.m_floats[1] = 0.0;
        pbVar17[iVar25].m_deltaLinearVelocity.m_floats[2] = 0.0;
        pbVar17[iVar25].m_deltaLinearVelocity.m_floats[3] = 0.0;
        pbVar17[iVar25].m_pushVelocity.m_floats[0] = 0.0;
        pbVar17[iVar25].m_pushVelocity.m_floats[1] = 0.0;
        pbVar17[iVar25].m_pushVelocity.m_floats[2] = 0.0;
        pbVar17[iVar25].m_pushVelocity.m_floats[3] = 0.0;
        pbVar17[iVar25].m_turnVelocity.m_floats[0] = 0.0;
        pbVar17[iVar25].m_turnVelocity.m_floats[1] = 0.0;
        pbVar17[iVar25].m_turnVelocity.m_floats[2] = 0.0;
        pbVar17[iVar25].m_turnVelocity.m_floats[3] = 0.0;
        local_128 = 1.0 / (infoGlobal->super_btContactSolverInfoData).m_timeStep;
        local_118 = pbVar29 + iVar33;
        local_124 = (infoGlobal->super_btContactSolverInfoData).m_erp;
        local_120 = &local_118->m_contactNormal1;
        pbStack_110 = &local_118->m_contactNormal2;
        local_108 = &local_118->m_relpos2CrossNormal;
        uStack_100 = 0x28;
        local_f8 = &local_118->m_rhs;
        pbStack_f0 = &local_118->m_cfm;
        local_118->m_cfm = (infoGlobal->super_btContactSolverInfoData).m_globalCfm;
        local_cc = (infoGlobal->super_btContactSolverInfoData).m_damping;
        local_e8 = &local_118->m_lowerLimit;
        local_e0 = &local_118->m_upperLimit;
        local_d0 = (infoGlobal->super_btContactSolverInfoData).m_numIterations;
        (*constraints[uVar35]->_vptr_btTypedConstraint[5])(constraints[uVar35],&local_128);
        if (0 < pbVar28[uVar35].m_numConstraintRows) {
          paVar30 = &pbVar29[iVar33].field_15;
          lVar27 = 0;
          do {
            fVar3 = constraints[uVar35]->m_breakingImpulseThreshold;
            if (fVar3 <= *(btScalar *)((long)paVar30 + -0xc)) {
              *(float *)((long)paVar30 + -0xc) = fVar3;
            }
            if (paVar30[-2].m_unusedPadding4 <= -fVar3) {
              paVar30[-2].m_unusedPadding4 = -fVar3;
            }
            paVar30->m_originalContactPoint = pbVar19;
            pbVar22 = pbVar19->m_rbA;
            fVar3 = (((btSolverConstraint *)(paVar30 + -0x11))->m_relpos1CrossNormal).m_floats[0];
            fVar4 = *(btScalar *)((long)paVar30 + -0x84);
            fVar5 = paVar30[-0x10].m_unusedPadding4;
            uVar13 = *(undefined8 *)(pbVar22->m_angularFactor).m_floats;
            auVar44._0_4_ =
                 (float)uVar13 *
                 (fVar5 * *(float *)&pbVar22->field_0x154 +
                 fVar3 * *(float *)&(pbVar22->super_btCollisionObject).field_0x14c +
                 *(float *)&pbVar22->field_0x150 * fVar4);
            auVar44._4_4_ =
                 (float)((ulong)uVar13 >> 0x20) *
                 (fVar5 * *(float *)&pbVar22->field_0x164 +
                 fVar3 * *(float *)&pbVar22->field_0x15c + *(float *)&pbVar22->field_0x160 * fVar4);
            auVar44._8_4_ =
                 (*(float *)&pbVar22->field_0x174 * fVar5 +
                 *(float *)&pbVar22->field_0x16c * fVar3 + *(float *)&pbVar22->field_0x170 * fVar4)
                 * (pbVar22->m_angularFactor).m_floats[2];
            auVar44._12_4_ = 0;
            *(undefined1 (*) [16])((btVector3 *)(paVar30 + -9))->m_floats = auVar44;
            pbVar22 = pbVar19->m_rbB;
            fVar6 = ((btVector3 *)(paVar30 + -0xd))->m_floats[0];
            fVar36 = *(btScalar *)((long)paVar30 + -100);
            fVar41 = paVar30[-0xc].m_unusedPadding4;
            uVar13 = *(undefined8 *)(pbVar22->m_angularFactor).m_floats;
            auVar51._0_4_ =
                 (float)uVar13 *
                 (fVar41 * *(float *)&pbVar22->field_0x154 +
                 fVar6 * *(float *)&(pbVar22->super_btCollisionObject).field_0x14c +
                 *(float *)&pbVar22->field_0x150 * fVar36);
            auVar51._4_4_ =
                 (float)((ulong)uVar13 >> 0x20) *
                 (fVar41 * *(float *)&pbVar22->field_0x164 +
                 fVar6 * *(float *)&pbVar22->field_0x15c + *(float *)&pbVar22->field_0x160 * fVar36)
            ;
            auVar51._8_4_ =
                 (*(float *)&pbVar22->field_0x174 * fVar41 +
                 *(float *)&pbVar22->field_0x16c * fVar6 + *(float *)&pbVar22->field_0x170 * fVar36)
                 * (pbVar22->m_angularFactor).m_floats[2];
            auVar51._12_4_ = 0;
            *(undefined1 (*) [16])((btVector3 *)(paVar30 + -7))->m_floats = auVar51;
            fVar42 = pbVar18->m_inverseMass;
            fVar7 = ((btVector3 *)(paVar30 + -0xf))->m_floats[0];
            fVar8 = *(btScalar *)((long)paVar30 + -0x74);
            fVar9 = paVar30[-0xe].m_unusedPadding4;
            fVar55 = body->m_inverseMass;
            fVar10 = ((btVector3 *)(paVar30 + -0xb))->m_floats[0];
            fVar11 = *(btScalar *)((long)paVar30 + -0x54);
            fVar12 = paVar30[-10].m_unusedPadding4;
            fVar42 = (*(float *)&body->field_0x174 * fVar41 +
                     *(float *)&body->field_0x16c * fVar6 + *(float *)&body->field_0x170 * fVar36) *
                     fVar41 + (*(float *)&body->field_0x154 * fVar41 +
                              *(float *)&(body->super_btCollisionObject).field_0x14c * fVar6 +
                              *(float *)&body->field_0x150 * fVar36) * fVar6 +
                              (*(float *)&body->field_0x164 * fVar41 +
                              *(float *)&body->field_0x15c * fVar6 +
                              *(float *)&body->field_0x160 * fVar36) * fVar36 +
                     fVar55 * fVar12 * fVar12 + fVar55 * fVar10 * fVar10 + fVar55 * fVar11 * fVar11
                     + fVar5 * (*(float *)&pbVar18->field_0x174 * fVar5 +
                               *(float *)&pbVar18->field_0x16c * fVar3 +
                               *(float *)&pbVar18->field_0x170 * fVar4) +
                       fVar3 * (*(float *)&pbVar18->field_0x154 * fVar5 +
                               *(float *)&(pbVar18->super_btCollisionObject).field_0x14c * fVar3 +
                               *(float *)&pbVar18->field_0x150 * fVar4) +
                       fVar4 * (*(float *)&pbVar18->field_0x164 * fVar5 +
                               *(float *)&pbVar18->field_0x15c * fVar3 +
                               *(float *)&pbVar18->field_0x160 * fVar4) +
                       fVar9 * fVar42 * fVar9 + fVar7 * fVar42 * fVar7 + fVar8 * fVar42 * fVar8;
            fVar55 = (float)(-(uint)(1.1920929e-07 < ABS(fVar42)) & (uint)(1.0 / fVar42));
            *(float *)((long)paVar30 + -0x1c) = fVar55;
            fVar42 = 0.0;
            bVar50 = 0.0;
            bVar43 = 0.0;
            bVar58 = 0.0;
            if (pbVar17[iVar24].m_originalBody != (btRigidBody *)0x0) {
              bVar50 = pbVar17[iVar24].m_externalForceImpulse.m_floats[0];
              bVar43 = pbVar17[iVar24].m_externalForceImpulse.m_floats[1];
              bVar58 = pbVar17[iVar24].m_externalForceImpulse.m_floats[2];
            }
            fVar49 = 0.0;
            bVar54 = 0.0;
            if (pbVar17[iVar24].m_originalBody != (btRigidBody *)0x0) {
              fVar42 = pbVar17[iVar24].m_externalTorqueImpulse.m_floats[0];
              fVar49 = pbVar17[iVar24].m_externalTorqueImpulse.m_floats[1];
              bVar54 = pbVar17[iVar24].m_externalTorqueImpulse.m_floats[2];
            }
            bVar57 = 0.0;
            bVar52 = 0.0;
            bVar37 = 0.0;
            fVar48 = 0.0;
            if (pbVar17[iVar25].m_originalBody != (btRigidBody *)0x0) {
              bVar52 = pbVar17[iVar25].m_externalForceImpulse.m_floats[0];
              bVar37 = pbVar17[iVar25].m_externalForceImpulse.m_floats[1];
              fVar48 = pbVar17[iVar25].m_externalForceImpulse.m_floats[2];
            }
            bVar56 = 0.0;
            fVar53 = 0.0;
            if (pbVar17[iVar25].m_originalBody != (btRigidBody *)0x0) {
              fVar53 = pbVar17[iVar25].m_externalTorqueImpulse.m_floats[0];
              bVar56 = pbVar17[iVar25].m_externalTorqueImpulse.m_floats[1];
              bVar57 = pbVar17[iVar25].m_externalTorqueImpulse.m_floats[2];
            }
            paVar30[-3].m_unusedPadding4 =
                 fVar55 * (0.0 - (fVar41 * (bVar57 + (body->m_angularVelocity).m_floats[2]) +
                                  fVar6 * (fVar53 + (body->m_angularVelocity).m_floats[0]) +
                                  fVar36 * (bVar56 + (body->m_angularVelocity).m_floats[1]) +
                                  fVar12 * (fVar48 + (body->m_linearVelocity).m_floats[2]) +
                                  fVar10 * (bVar52 + (body->m_linearVelocity).m_floats[0]) +
                                  fVar11 * (bVar37 + (body->m_linearVelocity).m_floats[1]) +
                                 fVar5 * (bVar54 + (pbVar18->m_angularVelocity).m_floats[2]) +
                                 fVar3 * (fVar42 + (pbVar18->m_angularVelocity).m_floats[0]) +
                                 fVar4 * (fVar49 + (pbVar18->m_angularVelocity).m_floats[1]) +
                                 fVar9 * (bVar58 + (pbVar18->m_linearVelocity).m_floats[2]) +
                                 fVar7 * (bVar50 + (pbVar18->m_linearVelocity).m_floats[0]) +
                                 fVar8 * (bVar43 + (pbVar18->m_linearVelocity).m_floats[1])) *
                                 local_cc) + paVar30[-3].m_unusedPadding4 * fVar55;
            *(btScalar *)((long)paVar30 + -0x24) = 0.0;
            lVar27 = lVar27 + 1;
            paVar30 = paVar30 + 0x14;
          } while (lVar27 < pbVar28[uVar35].m_numConstraintRows);
        }
      }
      iVar33 = iVar33 + (this->m_tmpConstraintSizesPool).m_data[uVar35].m_numConstraintRows;
      uVar35 = uVar35 + 1;
    } while (uVar35 != uVar26);
  }
  (*(this->super_btConstraintSolver)._vptr_btConstraintSolver[7])
            (this,manifoldPtr,(ulong)(uint)numManifolds,infoGlobal);
  uVar14 = (this->m_tmpSolverContactConstraintPool).m_size;
  uVar15 = (this->m_tmpSolverNonContactConstraintPool).m_size;
  uVar16 = (this->m_tmpSolverContactFrictionConstraintPool).m_size;
  if (((this->m_orderNonContactConstraintPool).m_size < (int)uVar15) &&
     ((this->m_orderNonContactConstraintPool).m_capacity < (int)uVar15)) {
    if (uVar15 == 0) {
      piVar31 = (int *)0x0;
    }
    else {
      piVar31 = (int *)btAlignedAllocInternal((long)(int)uVar15 << 2,0x10);
    }
    lVar27 = (long)(this->m_orderNonContactConstraintPool).m_size;
    if (0 < lVar27) {
      piVar23 = (this->m_orderNonContactConstraintPool).m_data;
      lVar32 = 0;
      do {
        piVar31[lVar32] = piVar23[lVar32];
        lVar32 = lVar32 + 1;
      } while (lVar27 != lVar32);
    }
    piVar23 = (this->m_orderNonContactConstraintPool).m_data;
    if (piVar23 != (int *)0x0) {
      if ((this->m_orderNonContactConstraintPool).m_ownsMemory == true) {
        btAlignedFreeInternal(piVar23);
      }
      (this->m_orderNonContactConstraintPool).m_data = (int *)0x0;
    }
    (this->m_orderNonContactConstraintPool).m_ownsMemory = true;
    (this->m_orderNonContactConstraintPool).m_data = piVar31;
    (this->m_orderNonContactConstraintPool).m_capacity = uVar15;
  }
  (this->m_orderNonContactConstraintPool).m_size = uVar15;
  if (((infoGlobal->super_btContactSolverInfoData).m_solverMode & 0x10) == 0) {
    if (((this->m_orderTmpConstraintPool).m_size < (int)uVar14) &&
       ((this->m_orderTmpConstraintPool).m_capacity < (int)uVar14)) {
      if (uVar14 == 0) {
        piVar31 = (int *)0x0;
      }
      else {
        piVar31 = (int *)btAlignedAllocInternal((long)(int)uVar14 << 2,0x10);
      }
      lVar27 = (long)(this->m_orderTmpConstraintPool).m_size;
      if (0 < lVar27) {
        piVar23 = (this->m_orderTmpConstraintPool).m_data;
        lVar32 = 0;
        do {
          piVar31[lVar32] = piVar23[lVar32];
          lVar32 = lVar32 + 1;
        } while (lVar27 != lVar32);
      }
      piVar23 = (this->m_orderTmpConstraintPool).m_data;
      if (piVar23 != (int *)0x0) {
        if ((this->m_orderTmpConstraintPool).m_ownsMemory == true) {
          btAlignedFreeInternal(piVar23);
        }
        (this->m_orderTmpConstraintPool).m_data = (int *)0x0;
      }
      (this->m_orderTmpConstraintPool).m_ownsMemory = true;
      (this->m_orderTmpConstraintPool).m_data = piVar31;
      (this->m_orderTmpConstraintPool).m_capacity = uVar14;
    }
    (this->m_orderTmpConstraintPool).m_size = uVar14;
  }
  else {
    iVar33 = uVar14 * 2;
    if (((this->m_orderTmpConstraintPool).m_size < iVar33) &&
       ((this->m_orderTmpConstraintPool).m_capacity < iVar33)) {
      if (uVar14 == 0) {
        piVar31 = (int *)0x0;
      }
      else {
        piVar31 = (int *)btAlignedAllocInternal((long)(int)uVar14 << 3,0x10);
      }
      lVar27 = (long)(this->m_orderTmpConstraintPool).m_size;
      if (0 < lVar27) {
        piVar23 = (this->m_orderTmpConstraintPool).m_data;
        lVar32 = 0;
        do {
          piVar31[lVar32] = piVar23[lVar32];
          lVar32 = lVar32 + 1;
        } while (lVar27 != lVar32);
      }
      piVar23 = (this->m_orderTmpConstraintPool).m_data;
      if (piVar23 != (int *)0x0) {
        if ((this->m_orderTmpConstraintPool).m_ownsMemory == true) {
          btAlignedFreeInternal(piVar23);
        }
        (this->m_orderTmpConstraintPool).m_data = (int *)0x0;
      }
      (this->m_orderTmpConstraintPool).m_ownsMemory = true;
      (this->m_orderTmpConstraintPool).m_data = piVar31;
      (this->m_orderTmpConstraintPool).m_capacity = iVar33;
    }
    (this->m_orderTmpConstraintPool).m_size = iVar33;
  }
  if (((this->m_orderFrictionConstraintPool).m_size < (int)uVar16) &&
     ((this->m_orderFrictionConstraintPool).m_capacity < (int)uVar16)) {
    if (uVar16 == 0) {
      piVar31 = (int *)0x0;
    }
    else {
      piVar31 = (int *)btAlignedAllocInternal((long)(int)uVar16 << 2,0x10);
    }
    lVar27 = (long)(this->m_orderFrictionConstraintPool).m_size;
    if (0 < lVar27) {
      piVar23 = (this->m_orderFrictionConstraintPool).m_data;
      lVar32 = 0;
      do {
        piVar31[lVar32] = piVar23[lVar32];
        lVar32 = lVar32 + 1;
      } while (lVar27 != lVar32);
    }
    piVar23 = (this->m_orderFrictionConstraintPool).m_data;
    if (piVar23 != (int *)0x0) {
      if ((this->m_orderFrictionConstraintPool).m_ownsMemory == true) {
        btAlignedFreeInternal(piVar23);
      }
      (this->m_orderFrictionConstraintPool).m_data = (int *)0x0;
    }
    (this->m_orderFrictionConstraintPool).m_ownsMemory = true;
    (this->m_orderFrictionConstraintPool).m_data = piVar31;
    (this->m_orderFrictionConstraintPool).m_capacity = uVar16;
  }
  (this->m_orderFrictionConstraintPool).m_size = uVar16;
  auVar44 = _DAT_001f5270;
  if (0 < (int)uVar15) {
    piVar31 = (this->m_orderNonContactConstraintPool).m_data;
    lVar27 = (ulong)uVar15 - 1;
    auVar38._8_4_ = (int)lVar27;
    auVar38._0_8_ = lVar27;
    auVar38._12_4_ = (int)((ulong)lVar27 >> 0x20);
    uVar26 = 0;
    auVar38 = auVar38 ^ _DAT_001f5270;
    auVar45 = _DAT_001f55c0;
    do {
      auVar51 = auVar45 ^ auVar44;
      if ((bool)(~(auVar51._4_4_ == auVar38._4_4_ && auVar38._0_4_ < auVar51._0_4_ ||
                  auVar38._4_4_ < auVar51._4_4_) & 1)) {
        piVar31[uVar26] = (int)uVar26;
      }
      if ((auVar51._12_4_ != auVar38._12_4_ || auVar51._8_4_ <= auVar38._8_4_) &&
          auVar51._12_4_ <= auVar38._12_4_) {
        piVar31[uVar26 + 1] = (int)uVar26 + 1;
      }
      uVar26 = uVar26 + 2;
      lVar27 = auVar45._8_8_;
      auVar45._0_8_ = auVar45._0_8_ + 2;
      auVar45._8_8_ = lVar27 + 2;
    } while ((uVar15 + 1 & 0xfffffffe) != uVar26);
  }
  auVar44 = _DAT_001f5270;
  if (0 < (int)uVar14) {
    piVar31 = (this->m_orderTmpConstraintPool).m_data;
    lVar27 = (ulong)uVar14 - 1;
    auVar39._8_4_ = (int)lVar27;
    auVar39._0_8_ = lVar27;
    auVar39._12_4_ = (int)((ulong)lVar27 >> 0x20);
    uVar26 = 0;
    auVar39 = auVar39 ^ _DAT_001f5270;
    auVar46 = _DAT_001f55c0;
    do {
      auVar51 = auVar46 ^ auVar44;
      if ((bool)(~(auVar51._4_4_ == auVar39._4_4_ && auVar39._0_4_ < auVar51._0_4_ ||
                  auVar39._4_4_ < auVar51._4_4_) & 1)) {
        piVar31[uVar26] = (int)uVar26;
      }
      if ((auVar51._12_4_ != auVar39._12_4_ || auVar51._8_4_ <= auVar39._8_4_) &&
          auVar51._12_4_ <= auVar39._12_4_) {
        piVar31[uVar26 + 1] = (int)uVar26 + 1;
      }
      uVar26 = uVar26 + 2;
      lVar27 = auVar46._8_8_;
      auVar46._0_8_ = auVar46._0_8_ + 2;
      auVar46._8_8_ = lVar27 + 2;
    } while ((uVar14 + 1 & 0xfffffffe) != uVar26);
  }
  auVar44 = _DAT_001f5270;
  if (0 < (int)uVar16) {
    piVar31 = (this->m_orderFrictionConstraintPool).m_data;
    lVar27 = (ulong)uVar16 - 1;
    auVar40._8_4_ = (int)lVar27;
    auVar40._0_8_ = lVar27;
    auVar40._12_4_ = (int)((ulong)lVar27 >> 0x20);
    uVar26 = 0;
    auVar40 = auVar40 ^ _DAT_001f5270;
    auVar47 = _DAT_001f55c0;
    do {
      auVar51 = auVar47 ^ auVar44;
      if ((bool)(~(auVar51._4_4_ == auVar40._4_4_ && auVar40._0_4_ < auVar51._0_4_ ||
                  auVar40._4_4_ < auVar51._4_4_) & 1)) {
        piVar31[uVar26] = (int)uVar26;
      }
      if ((auVar51._12_4_ != auVar40._12_4_ || auVar51._8_4_ <= auVar40._8_4_) &&
          auVar51._12_4_ <= auVar40._12_4_) {
        piVar31[uVar26 + 1] = (int)uVar26 + 1;
      }
      uVar26 = uVar26 + 2;
      lVar27 = auVar47._8_8_;
      auVar47._0_8_ = auVar47._0_8_ + 2;
      auVar47._8_8_ = lVar27 + 2;
    } while ((uVar16 + 1 & 0xfffffffe) != uVar26);
  }
  CProfileManager::Stop_Profile();
  return 0.0;
}

Assistant:

btScalar btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup(btCollisionObject** bodies, int numBodies, btPersistentManifold** manifoldPtr, int numManifolds,btTypedConstraint** constraints,int numConstraints,const btContactSolverInfo& infoGlobal,btIDebugDraw* debugDrawer)
{
	m_fixedBodyId = -1;
	BT_PROFILE("solveGroupCacheFriendlySetup");
	(void)debugDrawer;

	m_maxOverrideNumSolverIterations = 0;

#ifdef BT_ADDITIONAL_DEBUG
	 //make sure that dynamic bodies exist for all (enabled) constraints
	for (int i=0;i<numConstraints;i++)
	{
		btTypedConstraint* constraint = constraints[i];
		if (constraint->isEnabled())
		{
			if (!constraint->getRigidBodyA().isStaticOrKinematicObject())
			{
				bool found=false;
				for (int b=0;b<numBodies;b++)
				{

					if (&constraint->getRigidBodyA()==bodies[b])
					{
						found = true;
						break;
					}
				}
				btAssert(found);
			}
			if (!constraint->getRigidBodyB().isStaticOrKinematicObject())
			{
				bool found=false;
				for (int b=0;b<numBodies;b++)
				{
					if (&constraint->getRigidBodyB()==bodies[b])
					{
						found = true;
						break;
					}
				}
				btAssert(found);
			}
		}
	}
    //make sure that dynamic bodies exist for all contact manifolds
    for (int i=0;i<numManifolds;i++)
    {
        if (!manifoldPtr[i]->getBody0()->isStaticOrKinematicObject())
        {
            bool found=false;
            for (int b=0;b<numBodies;b++)
            {

                if (manifoldPtr[i]->getBody0()==bodies[b])
                {
                    found = true;
                    break;
                }
            }
            btAssert(found);
        }
        if (!manifoldPtr[i]->getBody1()->isStaticOrKinematicObject())
        {
            bool found=false;
            for (int b=0;b<numBodies;b++)
            {
                if (manifoldPtr[i]->getBody1()==bodies[b])
                {
                    found = true;
                    break;
                }
            }
            btAssert(found);
        }
    }
#endif //BT_ADDITIONAL_DEBUG


	for (int i = 0; i < numBodies; i++)
	{
		bodies[i]->setCompanionId(-1);
	}


	m_tmpSolverBodyPool.reserve(numBodies+1);
	m_tmpSolverBodyPool.resize(0);

	//btSolverBody& fixedBody = m_tmpSolverBodyPool.expand();
    //initSolverBody(&fixedBody,0);

	//convert all bodies


	for (int i=0;i<numBodies;i++)
	{
		int bodyId = getOrInitSolverBody(*bodies[i],infoGlobal.m_timeStep);

		btRigidBody* body = btRigidBody::upcast(bodies[i]);
		if (body && body->getInvMass())
		{
			btSolverBody& solverBody = m_tmpSolverBodyPool[bodyId];
			btVector3 gyroForce (0,0,0);
			if (body->getFlags()&BT_ENABLE_GYROSCOPIC_FORCE_EXPLICIT)
			{
				gyroForce = body->computeGyroscopicForceExplicit(infoGlobal.m_maxGyroscopicForce);
				solverBody.m_externalTorqueImpulse -= gyroForce*body->getInvInertiaTensorWorld()*infoGlobal.m_timeStep;
			}
			if (body->getFlags()&BT_ENABLE_GYROSCOPIC_FORCE_IMPLICIT_WORLD)
			{
				gyroForce = body->computeGyroscopicImpulseImplicit_World(infoGlobal.m_timeStep);
				solverBody.m_externalTorqueImpulse += gyroForce;
			}
			if (body->getFlags()&BT_ENABLE_GYROSCOPIC_FORCE_IMPLICIT_BODY)
			{
				gyroForce = body->computeGyroscopicImpulseImplicit_Body(infoGlobal.m_timeStep);
				solverBody.m_externalTorqueImpulse += gyroForce;

			}
			

		}
	}

	if (1)
	{
		int j;
		for (j=0;j<numConstraints;j++)
		{
			btTypedConstraint* constraint = constraints[j];
			constraint->buildJacobian();
			constraint->internalSetAppliedImpulse(0.0f);
		}
	}

	//btRigidBody* rb0=0,*rb1=0;

	//if (1)
	{
		{

			int totalNumRows = 0;
			int i;

			m_tmpConstraintSizesPool.resizeNoInitialize(numConstraints);
			//calculate the total number of contraint rows
			for (i=0;i<numConstraints;i++)
			{
				btTypedConstraint::btConstraintInfo1& info1 = m_tmpConstraintSizesPool[i];
				btJointFeedback* fb = constraints[i]->getJointFeedback();
				if (fb)
				{
					fb->m_appliedForceBodyA.setZero();
					fb->m_appliedTorqueBodyA.setZero();
					fb->m_appliedForceBodyB.setZero();
					fb->m_appliedTorqueBodyB.setZero();
				}

				if (constraints[i]->isEnabled())
				{
				}
				if (constraints[i]->isEnabled())
				{
					constraints[i]->getInfo1(&info1);
				} else
				{
					info1.m_numConstraintRows = 0;
					info1.nub = 0;
				}
				totalNumRows += info1.m_numConstraintRows;
			}
			m_tmpSolverNonContactConstraintPool.resizeNoInitialize(totalNumRows);


			///setup the btSolverConstraints
			int currentRow = 0;

			for (i=0;i<numConstraints;i++)
			{
				const btTypedConstraint::btConstraintInfo1& info1 = m_tmpConstraintSizesPool[i];

				if (info1.m_numConstraintRows)
				{
					btAssert(currentRow<totalNumRows);

					btSolverConstraint* currentConstraintRow = &m_tmpSolverNonContactConstraintPool[currentRow];
					btTypedConstraint* constraint = constraints[i];
					btRigidBody& rbA = constraint->getRigidBodyA();
					btRigidBody& rbB = constraint->getRigidBodyB();

					int solverBodyIdA = getOrInitSolverBody(rbA,infoGlobal.m_timeStep);
                    int solverBodyIdB = getOrInitSolverBody(rbB,infoGlobal.m_timeStep);

                    btSolverBody* bodyAPtr = &m_tmpSolverBodyPool[solverBodyIdA];
                    btSolverBody* bodyBPtr = &m_tmpSolverBodyPool[solverBodyIdB];




					int overrideNumSolverIterations = constraint->getOverrideNumSolverIterations() > 0 ? constraint->getOverrideNumSolverIterations() : infoGlobal.m_numIterations;
					if (overrideNumSolverIterations>m_maxOverrideNumSolverIterations)
						m_maxOverrideNumSolverIterations = overrideNumSolverIterations;


					int j;
					for ( j=0;j<info1.m_numConstraintRows;j++)
					{
						memset(&currentConstraintRow[j],0,sizeof(btSolverConstraint));
						currentConstraintRow[j].m_lowerLimit = -SIMD_INFINITY;
						currentConstraintRow[j].m_upperLimit = SIMD_INFINITY;
						currentConstraintRow[j].m_appliedImpulse = 0.f;
						currentConstraintRow[j].m_appliedPushImpulse = 0.f;
						currentConstraintRow[j].m_solverBodyIdA = solverBodyIdA;
						currentConstraintRow[j].m_solverBodyIdB = solverBodyIdB;
						currentConstraintRow[j].m_overrideNumSolverIterations = overrideNumSolverIterations;
					}

					bodyAPtr->internalGetDeltaLinearVelocity().setValue(0.f,0.f,0.f);
					bodyAPtr->internalGetDeltaAngularVelocity().setValue(0.f,0.f,0.f);
					bodyAPtr->internalGetPushVelocity().setValue(0.f,0.f,0.f);
					bodyAPtr->internalGetTurnVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetDeltaLinearVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetDeltaAngularVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetPushVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetTurnVelocity().setValue(0.f,0.f,0.f);


					btTypedConstraint::btConstraintInfo2 info2;
					info2.fps = 1.f/infoGlobal.m_timeStep;
					info2.erp = infoGlobal.m_erp;
					info2.m_J1linearAxis = currentConstraintRow->m_contactNormal1;
					info2.m_J1angularAxis = currentConstraintRow->m_relpos1CrossNormal;
					info2.m_J2linearAxis = currentConstraintRow->m_contactNormal2;
					info2.m_J2angularAxis = currentConstraintRow->m_relpos2CrossNormal;
					info2.rowskip = sizeof(btSolverConstraint)/sizeof(btScalar);//check this
					///the size of btSolverConstraint needs be a multiple of btScalar
		            btAssert(info2.rowskip*sizeof(btScalar)== sizeof(btSolverConstraint));
					info2.m_constraintError = &currentConstraintRow->m_rhs;
					currentConstraintRow->m_cfm = infoGlobal.m_globalCfm;
					info2.m_damping = infoGlobal.m_damping;
					info2.cfm = &currentConstraintRow->m_cfm;
					info2.m_lowerLimit = &currentConstraintRow->m_lowerLimit;
					info2.m_upperLimit = &currentConstraintRow->m_upperLimit;
					info2.m_numIterations = infoGlobal.m_numIterations;
					constraints[i]->getInfo2(&info2);

					///finalize the constraint setup
					for ( j=0;j<info1.m_numConstraintRows;j++)
					{
						btSolverConstraint& solverConstraint = currentConstraintRow[j];

						if (solverConstraint.m_upperLimit>=constraints[i]->getBreakingImpulseThreshold())
						{
							solverConstraint.m_upperLimit = constraints[i]->getBreakingImpulseThreshold();
						}

						if (solverConstraint.m_lowerLimit<=-constraints[i]->getBreakingImpulseThreshold())
						{
							solverConstraint.m_lowerLimit = -constraints[i]->getBreakingImpulseThreshold();
						}

						solverConstraint.m_originalContactPoint = constraint;

						{
							const btVector3& ftorqueAxis1 = solverConstraint.m_relpos1CrossNormal;
							solverConstraint.m_angularComponentA = constraint->getRigidBodyA().getInvInertiaTensorWorld()*ftorqueAxis1*constraint->getRigidBodyA().getAngularFactor();
						}
						{
							const btVector3& ftorqueAxis2 = solverConstraint.m_relpos2CrossNormal;
							solverConstraint.m_angularComponentB = constraint->getRigidBodyB().getInvInertiaTensorWorld()*ftorqueAxis2*constraint->getRigidBodyB().getAngularFactor();
						}

						{
							btVector3 iMJlA = solverConstraint.m_contactNormal1*rbA.getInvMass();
							btVector3 iMJaA = rbA.getInvInertiaTensorWorld()*solverConstraint.m_relpos1CrossNormal;
							btVector3 iMJlB = solverConstraint.m_contactNormal2*rbB.getInvMass();//sign of normal?
							btVector3 iMJaB = rbB.getInvInertiaTensorWorld()*solverConstraint.m_relpos2CrossNormal;

							btScalar sum = iMJlA.dot(solverConstraint.m_contactNormal1);
							sum += iMJaA.dot(solverConstraint.m_relpos1CrossNormal);
							sum += iMJlB.dot(solverConstraint.m_contactNormal2);
							sum += iMJaB.dot(solverConstraint.m_relpos2CrossNormal);
							btScalar fsum = btFabs(sum);
							btAssert(fsum > SIMD_EPSILON);
							solverConstraint.m_jacDiagABInv = fsum>SIMD_EPSILON?btScalar(1.)/sum : 0.f;
						}



						{
							btScalar rel_vel;
							btVector3 externalForceImpulseA = bodyAPtr->m_originalBody ? bodyAPtr->m_externalForceImpulse : btVector3(0,0,0);
							btVector3 externalTorqueImpulseA = bodyAPtr->m_originalBody ? bodyAPtr->m_externalTorqueImpulse : btVector3(0,0,0);

							btVector3 externalForceImpulseB = bodyBPtr->m_originalBody ? bodyBPtr->m_externalForceImpulse : btVector3(0,0,0);
							btVector3 externalTorqueImpulseB = bodyBPtr->m_originalBody ?bodyBPtr->m_externalTorqueImpulse : btVector3(0,0,0);

							btScalar vel1Dotn = solverConstraint.m_contactNormal1.dot(rbA.getLinearVelocity()+externalForceImpulseA)
												+ solverConstraint.m_relpos1CrossNormal.dot(rbA.getAngularVelocity()+externalTorqueImpulseA);

							btScalar vel2Dotn = solverConstraint.m_contactNormal2.dot(rbB.getLinearVelocity()+externalForceImpulseB)
																+ solverConstraint.m_relpos2CrossNormal.dot(rbB.getAngularVelocity()+externalTorqueImpulseB);

							rel_vel = vel1Dotn+vel2Dotn;
							btScalar restitution = 0.f;
							btScalar positionalError = solverConstraint.m_rhs;//already filled in by getConstraintInfo2
							btScalar	velocityError = restitution - rel_vel * info2.m_damping;
							btScalar	penetrationImpulse = positionalError*solverConstraint.m_jacDiagABInv;
							btScalar	velocityImpulse = velocityError *solverConstraint.m_jacDiagABInv;
							solverConstraint.m_rhs = penetrationImpulse+velocityImpulse;
							solverConstraint.m_appliedImpulse = 0.f;


						}
					}
				}
				currentRow+=m_tmpConstraintSizesPool[i].m_numConstraintRows;
			}
		}

		convertContacts(manifoldPtr,numManifolds,infoGlobal);

	}

//	btContactSolverInfo info = infoGlobal;


	int numNonContactPool = m_tmpSolverNonContactConstraintPool.size();
	int numConstraintPool = m_tmpSolverContactConstraintPool.size();
	int numFrictionPool = m_tmpSolverContactFrictionConstraintPool.size();

	///@todo: use stack allocator for such temporarily memory, same for solver bodies/constraints
	m_orderNonContactConstraintPool.resizeNoInitialize(numNonContactPool);
	if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
		m_orderTmpConstraintPool.resizeNoInitialize(numConstraintPool*2);
	else
		m_orderTmpConstraintPool.resizeNoInitialize(numConstraintPool);

	m_orderFrictionConstraintPool.resizeNoInitialize(numFrictionPool);
	{
		int i;
		for (i=0;i<numNonContactPool;i++)
		{
			m_orderNonContactConstraintPool[i] = i;
		}
		for (i=0;i<numConstraintPool;i++)
		{
			m_orderTmpConstraintPool[i] = i;
		}
		for (i=0;i<numFrictionPool;i++)
		{
			m_orderFrictionConstraintPool[i] = i;
		}
	}

	return 0.f;

}